

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatterSPH.cpp
# Opt level: O1

void __thiscall chrono::ChMatterSPH::VariablesQbSetSpeed(ChMatterSPH *this,double step)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  element_type *peVar6;
  pointer psVar7;
  uint uVar8;
  ulong uVar9;
  double dVar10;
  double oos;
  ChVector<double> local_98;
  ChVectorRef local_80;
  RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_> local_68;
  ChVectorRef *local_50;
  undefined8 local_48;
  long local_38;
  
  psVar7 = (this->nodes).
           super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->nodes).
      super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != psVar7) {
    dVar10 = 1.0 / step;
    uVar8 = 1;
    uVar9 = 0;
    do {
      peVar6 = psVar7[uVar9].super___shared_ptr<chrono::ChNodeSPH,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      dVar1 = (peVar6->super_ChNodeXYZ).pos_dt.m_data[0];
      dVar2 = (peVar6->super_ChNodeXYZ).pos_dt.m_data[1];
      dVar3 = (peVar6->super_ChNodeXYZ).pos_dt.m_data[2];
      ChVariables::Get_qb(&local_80,
                          &((psVar7[uVar9].
                             super___shared_ptr<chrono::ChNodeSPH,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->variables).super_ChVariables);
      local_68._0_8_ =
           local_80.
           super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
           ._0_8_;
      local_68._8_8_ = 3;
      local_48 = 0;
      local_38 = local_80.
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                 ._8_8_;
      local_50 = &local_80;
      if ((long)local_80.
                super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                ._8_8_ < 3) {
        __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                      ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                      "Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                     );
      }
      ChVector<double>::
      ChVector<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>,_1,1,false>>
                (&local_98,
                 (MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>_>
                  *)&local_68,(type *)0x0);
      if (&(peVar6->super_ChNodeXYZ).pos_dt != &local_98) {
        (peVar6->super_ChNodeXYZ).pos_dt.m_data[0] = local_98.m_data[0];
        (peVar6->super_ChNodeXYZ).pos_dt.m_data[1] = local_98.m_data[1];
        (peVar6->super_ChNodeXYZ).pos_dt.m_data[2] = local_98.m_data[2];
      }
      if ((step != 0.0) || (NAN(step))) {
        peVar6 = (this->nodes).
                 super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar9].
                 super___shared_ptr<chrono::ChNodeSPH,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        dVar4 = *(double *)((long)&peVar6->super_ChNodeXYZ + 0x30);
        dVar5 = *(double *)((long)&peVar6->super_ChNodeXYZ + 0x28);
        ((ChVector<double> *)((long)&peVar6->super_ChNodeXYZ + 0x38))->m_data[0] =
             dVar10 * (((ChVector<double> *)((long)&peVar6->super_ChNodeXYZ + 0x20))->m_data[0] -
                      dVar1);
        *(double *)((long)&peVar6->super_ChNodeXYZ + 0x40) = dVar10 * (dVar5 - dVar2);
        *(double *)((long)&peVar6->super_ChNodeXYZ + 0x48) = dVar10 * (dVar4 - dVar3);
      }
      uVar9 = (ulong)uVar8;
      psVar7 = (this->nodes).
               super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar8 = uVar8 + 1;
    } while (uVar9 < (ulong)((long)(this->nodes).
                                   super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)psVar7 >> 4));
  }
  return;
}

Assistant:

void ChMatterSPH::VariablesQbSetSpeed(double step) {
    for (unsigned int j = 0; j < nodes.size(); j++) {
        ChVector<> old_pos_dt = nodes[j]->GetPos_dt();

        // from 'qb' vector, sets body speed, and updates auxiliary data
        nodes[j]->SetPos_dt(nodes[j]->variables.Get_qb().segment(0, 3));

        // Compute accel. by BDF (approximate by differentiation);
        if (step) {
            nodes[j]->SetPos_dtdt((nodes[j]->GetPos_dt() - old_pos_dt) / step);
        }
    }
}